

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O2

int mbedtls_asn1_write_octet_string(uchar **p,uchar *start,uchar *buf,size_t size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  
  uVar2 = (uint)size;
  uVar3 = 0xffffff94;
  if ((long)(int)uVar2 <= (long)*p - (long)start) {
    puVar4 = *p + -size;
    *p = puVar4;
    memcpy(puVar4,buf,size);
    uVar3 = uVar2;
    if (((-1 < (int)uVar2) &&
        (uVar1 = mbedtls_asn1_write_len(p,start,(ulong)(uVar2 & 0x7fffffff)), uVar3 = uVar1,
        -1 < (int)uVar1)) &&
       (puVar4 = *p, uVar3 = 0xffffff94, puVar4 != start && -1 < (long)puVar4 - (long)start)) {
      *p = puVar4 + -1;
      puVar4[-1] = '\x04';
      uVar3 = uVar2 + uVar1 + 1;
    }
  }
  return uVar3;
}

Assistant:

int mbedtls_asn1_write_octet_string( unsigned char **p, unsigned char *start,
                             const unsigned char *buf, size_t size )
{
    int ret;
    size_t len = 0;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_raw_buffer( p, start, buf, size ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_OCTET_STRING ) );

    return( (int) len );
}